

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O0

void ProgramOptions::getCharsFromFile
               (string *fileName,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *result)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  uint32_t local_28c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  iterator it;
  undefined1 local_270 [12];
  undefined1 local_260 [12];
  string local_250 [8];
  string str;
  long local_220;
  ifstream fs;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *result_local;
  string *fileName_local;
  
  std::ifstream::ifstream(&local_220,(string *)fileName,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_260,
               (istream_type *)&local_220);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_270);
    std::allocator<char>::allocator();
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_270._0_8_;
    __end._M_c = local_270._8_4_;
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_260._0_8_;
    __beg._M_c = local_260._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (local_250,__beg,__end,(allocator<char> *)((long)&it._M_current + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    local_280._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_288._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=(&local_280,&local_288);
      if (!bVar2) break;
      end._M_current = (char *)std::__cxx11::string::end();
      local_28c = utf8::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            (&local_280,end);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (result,&local_28c);
    }
    std::__cxx11::string::~string(local_250);
    std::ifstream::~ifstream(&local_220);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"can\'t open characters file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ProgramOptions::getCharsFromFile(const std::string& fileName, std::set<std::uint32_t>& result)
{
    std::ifstream fs(fileName, std::ifstream::binary);
    if (!fs)
        throw std::runtime_error("can't open characters file");
    std::string str((std::istreambuf_iterator<char>(fs)),
                    std::istreambuf_iterator<char>());

    for (auto it = str.begin(); it != str.end();)
        result.insert(utf8::next(it, str.end()));
}